

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O2

Node * __thiscall wasm::DataFlow::Graph::visitExpression(Graph *this,Expression *curr)

{
  Id IVar1;
  pointer ppNVar2;
  Node *pNVar3;
  Fatal local_198;
  
  IVar1 = curr->_id;
  switch(IVar1) {
  case BlockId:
    pNVar3 = doVisitBlock(this,(Block *)curr);
    return pNVar3;
  case IfId:
    pNVar3 = doVisitIf(this,(If *)curr);
    return pNVar3;
  case LoopId:
    pNVar3 = doVisitLoop(this,(Loop *)curr);
    return pNVar3;
  case BreakId:
    pNVar3 = doVisitBreak(this,(Break *)curr);
    return pNVar3;
  case SwitchId:
    pNVar3 = doVisitSwitch(this,(Switch *)curr);
    return pNVar3;
  case CallId:
  case CallIndirectId:
  case GlobalGetId:
  case GlobalSetId:
  case LoadId:
  case StoreId:
  case ReturnId:
  case MemorySizeId:
  case MemoryGrowId:
  case NopId:
    goto switchD_009be5a5_caseD_6;
  case LocalGetId:
    pNVar3 = doVisitLocalGet(this,(LocalGet *)curr);
    return pNVar3;
  case LocalSetId:
    pNVar3 = doVisitLocalSet(this,(LocalSet *)curr);
    return pNVar3;
  case ConstId:
    pNVar3 = doVisitConst(this,(Const *)curr);
    return pNVar3;
  case UnaryId:
    pNVar3 = doVisitUnary(this,(Unary *)curr);
    return pNVar3;
  case BinaryId:
    pNVar3 = doVisitBinary(this,(Binary *)curr);
    return pNVar3;
  case SelectId:
    pNVar3 = doVisitSelect(this,(Select *)curr);
    return pNVar3;
  case DropId:
    pNVar3 = doVisitDrop(this,(Drop *)curr);
    return pNVar3;
  case UnreachableId:
    ppNVar2 = (this->locals).
              super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    if ((this->locals).
        super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
        super__Vector_impl_data._M_finish != ppNVar2) {
      (this->locals).
      super__Vector_base<wasm::DataFlow::Node_*,_std::allocator<wasm::DataFlow::Node_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppNVar2;
    }
    return &this->bad;
  default:
    if ((IVar1 < 0x38) && ((0xd0000000000000U >> ((ulong)(uint)IVar1 & 0x3f) & 1) != 0)) {
      Fatal::Fatal(&local_198);
      Fatal::operator<<(&local_198,(char (*) [46])"DataFlow does not support EH instructions yet");
      Fatal::~Fatal(&local_198);
    }
switchD_009be5a5_caseD_6:
    pNVar3 = doVisitGeneric(this,curr);
    return pNVar3;
  }
}

Assistant:

Node* visitExpression(Expression* curr) {
    // TODO Exception handling instruction support

    // Control flow and get/set etc. are special. Aside from them, we just need
    // to do something very generic.
    if (auto* block = curr->dynCast<Block>()) {
      return doVisitBlock(block);
    } else if (auto* iff = curr->dynCast<If>()) {
      return doVisitIf(iff);
    } else if (auto* loop = curr->dynCast<Loop>()) {
      return doVisitLoop(loop);
    } else if (auto* get = curr->dynCast<LocalGet>()) {
      return doVisitLocalGet(get);
    } else if (auto* set = curr->dynCast<LocalSet>()) {
      return doVisitLocalSet(set);
    } else if (auto* br = curr->dynCast<Break>()) {
      return doVisitBreak(br);
    } else if (auto* sw = curr->dynCast<Switch>()) {
      return doVisitSwitch(sw);
    } else if (auto* c = curr->dynCast<Const>()) {
      return doVisitConst(c);
    } else if (auto* unary = curr->dynCast<Unary>()) {
      return doVisitUnary(unary);
    } else if (auto* binary = curr->dynCast<Binary>()) {
      return doVisitBinary(binary);
    } else if (auto* select = curr->dynCast<Select>()) {
      return doVisitSelect(select);
    } else if (auto* unreachable = curr->dynCast<Unreachable>()) {
      return doVisitUnreachable(unreachable);
    } else if (auto* drop = curr->dynCast<Drop>()) {
      return doVisitDrop(drop);
    } else if (curr->is<Try>() || curr->is<Throw>() || curr->is<Rethrow>()) {
      Fatal() << "DataFlow does not support EH instructions yet";
    } else {
      return doVisitGeneric(curr);
    }
  }